

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTail.cpp
# Opt level: O2

void __thiscall liblogger::LogTail::Log(LogTail *this,LogType Type,string *str)

{
  LogManagerScopedLock lock;
  LogManagerScopedLock local_19;
  
  LogManager::Lock();
  local_19.m_locked = true;
  if (this->m_length <=
      (this->m_data).
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size) {
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&this->m_data);
  }
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_data,str);
  LogManagerScopedLock::~LogManagerScopedLock(&local_19);
  return;
}

Assistant:

void LogTail::Log(const LogType Type, const std::string &str) {
	LogManagerScopedLock lock = LogManagerScopedLock();
	if (m_data.size() >= m_length)
		m_data.pop_front();
	m_data.push_back(str);
}